

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverMaxPlus.h
# Opt level: O1

double __thiscall
BGIP_SolverMaxPlus<JointPolicyPureVector>::Solve(BGIP_SolverMaxPlus<JointPolicyPureVector> *this)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> vars;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  var_indices;
  shared_ptr<JointPolicyPureVector> temp;
  Properties props;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> facs;
  JointPolicyPureVector jpolBG;
  MaxPlus mp;
  FactorGraph fg;
  long *local_458;
  shared_count asStack_450 [2];
  double local_440;
  undefined1 local_438 [16];
  long local_428;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_418;
  JointPolicyPureVector *local_3f8;
  shared_count local_3f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  local_3e8;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_3b8;
  undefined1 local_398 [104];
  long local_330;
  PropertyKey local_300 [13];
  long local_160;
  code *local_100 [2];
  void *local_f0;
  long local_e0;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_d8;
  void *local_c0;
  long local_b0;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_a8 [24];
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_90 [24];
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_78 [24];
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_libDAI::TFactor<double>_>,_std::_Select1st<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
  local_60 [48];
  
  lVar4 = *(long *)&(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                    field_0x10;
  local_458 = *(long **)&(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                         field_0x8;
  asStack_450[0].pi_ =
       *(sp_counted_base **)
        &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x10;
  if (lVar4 != 0) {
    LOCK();
    piVar1 = (int *)(lVar4 + 8);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  local_438 = ZEXT816(0) << 0x20;
  local_418.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_428 = 0;
  uVar11 = (uint)(7 < *(int *)&this->field_0x130);
  local_418.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = local_438;
  MaxPlusSolverForBGs::Construct_AgentTypePair_Variables
            ((shared_ptr *)&local_458,(vector *)&local_418,(vector *)local_438,uVar11);
  local_3b8.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b8.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MaxPlusSolverForBGs::Construct_JointType_Factors
            ((shared_ptr *)&local_458,(vector *)&local_418,(vector *)local_438,(vector *)&local_3b8,
             uVar11);
  libDAI::FactorGraph::FactorGraph((FactorGraph *)local_100,(vector *)&local_3b8);
  local_3e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3e8._M_impl.super__Rb_tree_header._M_header;
  local_3e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar2 = &local_300[0].field_2;
  local_3e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3e8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_300[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"maxiter","");
  local_398._0_8_ = operator_new(0x10);
  ((placeholder *)local_398._0_8_)->_vptr_placeholder = (_func_int **)&PTR__placeholder_00135760;
  ((placeholder *)(local_398._0_8_ + 8))->_vptr_placeholder =
       *(_func_int ***)&this->super_MaxPlusSolverForBGs;
  libDAI::Properties::Set((Properties *)&local_3e8,local_300,(PropertyValue *)local_398);
  if ((placeholder *)local_398._0_8_ != (placeholder *)0x0) {
    (*(*(_func_int ***)local_398._0_8_)[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_300[0]._M_dataplus._M_p,local_300[0].field_2._M_allocated_capacity + 1);
  }
  iVar3 = *(int *)&this->field_0x130;
  local_300[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"verbose","");
  local_398._0_8_ = operator_new(0x10);
  ((placeholder *)local_398._0_8_)->_vptr_placeholder = (_func_int **)&PTR__placeholder_00135760;
  ((placeholder *)(local_398._0_8_ + 8))->_vptr_placeholder = (_func_int **)(long)iVar3;
  libDAI::Properties::Set((Properties *)&local_3e8,local_300,(PropertyValue *)local_398);
  if ((placeholder *)local_398._0_8_ != (placeholder *)0x0) {
    (*(*(_func_int ***)local_398._0_8_)[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_300[0]._M_dataplus._M_p,local_300[0].field_2._M_allocated_capacity + 1);
  }
  local_300[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"updates","");
  boost::any::any<std::__cxx11::string&>
            ((any *)local_398,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->field_0x110
             ,(type *)0x0,(type *)0x0);
  libDAI::Properties::Set((Properties *)&local_3e8,local_300,(PropertyValue *)local_398);
  if ((placeholder *)local_398._0_8_ != (placeholder *)0x0) {
    (*(*(_func_int ***)local_398._0_8_)[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_300[0]._M_dataplus._M_p,local_300[0].field_2._M_allocated_capacity + 1);
  }
  local_300[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"damping","");
  local_398._0_8_ = operator_new(0x10);
  ((placeholder *)local_398._0_8_)->_vptr_placeholder = (_func_int **)&PTR__placeholder_00135810;
  ((placeholder *)(local_398._0_8_ + 8))->_vptr_placeholder = *(_func_int ***)&this->field_0x138;
  libDAI::Properties::Set((Properties *)&local_3e8,local_300,(PropertyValue *)local_398);
  if ((placeholder *)local_398._0_8_ != (placeholder *)0x0) {
    (*(*(_func_int ***)local_398._0_8_)[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_300[0]._M_dataplus._M_p,local_300[0].field_2._M_allocated_capacity + 1);
  }
  local_300[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"tol","");
  local_398._0_8_ = operator_new(0x10);
  ((placeholder *)local_398._0_8_)->_vptr_placeholder = (_func_int **)&PTR__placeholder_00135810;
  ((placeholder *)(local_398._0_8_ + 8))->_vptr_placeholder = (_func_int **)0x3f1a36e2eb1c432d;
  libDAI::Properties::Set((Properties *)&local_3e8,local_300,(PropertyValue *)local_398);
  if ((placeholder *)local_398._0_8_ != (placeholder *)0x0) {
    (*(*(_func_int ***)local_398._0_8_)[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_300[0]._M_dataplus._M_p,local_300[0].field_2._M_allocated_capacity + 1);
  }
  libDAI::MaxPlus::MaxPlus((MaxPlus *)local_300,(FactorGraph *)local_100,(Properties *)&local_3e8,1)
  ;
  libDAI::MaxPlus::init();
  if ((this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0xc8 == '\x01')
  {
    libDAI::MaxPlus::SetAnyTimeResults
              (false,(ofstream *)0x1,
               *(ofstream **)
                &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0xd0
              );
  }
  local_440 = (double)libDAI::MaxPlus::run();
  BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>::GetNewJpol
            ((BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector> *)local_398);
  boost::dynamic_pointer_cast<JointPolicyPureVector,JointPolicyDiscretePure>
            ((boost *)&local_3f8,(shared_ptr<JointPolicyDiscretePure> *)local_398);
  boost::detail::shared_count::~shared_count((shared_count *)(local_398 + 8));
  JointPolicyPureVector::JointPolicyPureVector((JointPolicyPureVector *)local_398,local_3f8);
  uVar11 = 0;
  while( true ) {
    uVar7 = (**(code **)(*local_458 + 0x18))();
    uVar12 = (ulong)uVar11;
    if (uVar7 <= uVar12) {
      BGIPSolution::AddSolution
                ((JointPolicyPureVector *)
                 &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                  field_0x18,local_440);
      JointPolicyPureVector::~JointPolicyPureVector((JointPolicyPureVector *)local_398);
      boost::detail::shared_count::~shared_count(&local_3f0);
      libDAI::MaxPlus::~MaxPlus((MaxPlus *)local_300);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
      ::~_Rb_tree(&local_3e8);
      local_100[0] = GeneralizedMAAStarPlanner::GetJointPolicyDiscretePure;
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_libDAI::TFactor<double>_>,_std::_Select1st<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
      ::~_Rb_tree(local_60);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector(local_78);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector(local_90);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector(local_a8);
      if (local_c0 != (void *)0x0) {
        operator_delete(local_c0,local_b0 - (long)local_c0);
      }
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
                (&local_d8);
      if (local_f0 != (void *)0x0) {
        operator_delete(local_f0,local_e0 - (long)local_f0);
      }
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
                (&local_3b8);
      if ((void *)local_438._0_8_ != (void *)0x0) {
        operator_delete((void *)local_438._0_8_,local_428 - local_438._0_8_);
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_418);
      boost::detail::shared_count::~shared_count(asStack_450);
      return local_440;
    }
    uVar7 = local_458[0x14] - local_458[0x13] >> 3;
    if (uVar7 <= uVar12) break;
    uVar5 = *(ulong *)(local_458[0x13] + uVar12 * 8);
    uVar9 = 0;
    uVar10 = 1;
    while (uVar9 < uVar5) {
      lVar4 = *(long *)(local_330 + uVar12 * 8);
      lVar6 = *(long *)(lVar4 + 0x38);
      if ((ulong)(*(long *)(lVar4 + 0x40) - lVar6 >> 2) <= uVar9) goto LAB_00120b1a;
      *(undefined4 *)(lVar6 + uVar9 * 4) =
           *(undefined4 *)
            (local_160 +
            (ulong)local_418.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9] * 8);
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
      if (uVar7 <= uVar12) goto LAB_00120b09;
    }
    uVar11 = uVar11 + 1;
  }
LAB_00120b09:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar12);
LAB_00120b1a:
  uVar8 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  JointPolicyPureVector::~JointPolicyPureVector((JointPolicyPureVector *)local_398);
  boost::detail::shared_count::~shared_count(&local_3f0);
  libDAI::MaxPlus::~MaxPlus((MaxPlus *)local_300);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ::~_Rb_tree(&local_3e8);
  libDAI::FactorGraph::~FactorGraph((FactorGraph *)local_100);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            (&local_3b8);
  if ((void *)local_438._0_8_ != (void *)0x0) {
    operator_delete((void *)local_438._0_8_,local_428 - local_438._0_8_);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_418);
  boost::detail::shared_count::~shared_count(asStack_450);
  _Unwind_Resume(uVar8);
}

Assistant:

double Solve()
        {
            boost::shared_ptr<const BayesianGameIdenticalPayoffInterface> bgip = 
                BayesianGameIdenticalPayoffSolver_T<JP>::GetBGIPI();

            //an assignment of variables (v3, v8, v14) corresponds to an assignment
            //of joint actions (a1, a2, a3) for a particular joint type.
            //I.e., each (the action taken for eah) (agent,type)-pair is a variable 
            //of the factor graph.
            //let's create these variables
    
            // var_indices[agI][tI] stores the (agent,type)-pair index atI
            std::vector< std::vector<Index> > var_indices;    
            // vars stores the variables. vars[atI]
            std::vector< libDAI::Var > vars;
            bool debug = (_m_verbosity > 7);
            Construct_AgentTypePair_Variables(bgip, var_indices, vars, debug);
            
            //each joint type corresponds to a factor... 
            //let's create them
            std::vector<libDAI::Factor> facs;
            Construct_JointType_Factors(bgip, var_indices, vars, facs, debug);

            //and finally you construct the FactorGraph from that:
            libDAI::FactorGraph fg(facs);

            //size_t  maxiter = 1000;
            //size_t  verb = 2;
            libDAI::Properties props;
            props.Set("maxiter",_m_maxiter);
            //libDAI expects verbosity to be a size_t and will actually crash!
            size_t verb = static_cast<size_t>(_m_verbosity);
            props.Set("verbose", verb);
            props.Set("updates",_m_updateType);
            props.Set("damping",_m_damping);
            double  tol = 1e-4;
            props.Set("tol",tol);
            libDAI::MaxPlus mp (fg, props);
            mp.init();
            if(BayesianGameIdenticalPayoffSolver_T<JP>::GetWriteAnyTimeResults())
                mp.SetAnyTimeResults(true,
                                     BayesianGameIdenticalPayoffSolver_T<JP>::GetResultsOFStream(),
                                     BayesianGameIdenticalPayoffSolver_T<JP>::GetTimingsOFStream());
            double value = mp.run();
            
            //Create the BG policy as computed by MaxPlus...
            
            const std::vector<size_t> & config = mp.GetBestConfiguration();
            // construct the JP with the bgip now
            //JP jpolBG( BayesianGameIdenticalPayoffSolver_T<JP>::_m_solution.GetJointPolicyPureVector() );
            boost::shared_ptr<JP> temp = 
                boost::dynamic_pointer_cast<JP>( BayesianGameIdenticalPayoffSolver_T<JP>::GetNewJpol() );
            JP jpolBG( *temp);
//            delete temp;
            for(Index agI = 0; agI < bgip->GetNrAgents(); agI++)
                for(Index tI = 0; tI < bgip->GetNrTypes(agI); tI++)
                {
                    Index varIndex = var_indices[agI][tI];
                    Index bestAction = config[varIndex];
                    jpolBG.SetAction(agI, tI, bestAction);
                }
            //store the solution
            BayesianGameIdenticalPayoffSolver_T<JP>::AddSolution(jpolBG, value);
            
            return(value);
        }